

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

word * makeArrayB(word **a,int nFuncs)

{
  word *pwVar1;
  word *b;
  int i;
  int nFuncs_local;
  word **a_local;
  
  pwVar1 = (word *)malloc((long)nFuncs << 3);
  for (b._0_4_ = 0; (int)b < nFuncs; b._0_4_ = (int)b + 1) {
    pwVar1[(int)b] = *a[(int)b];
  }
  return pwVar1;
}

Assistant:

word* makeArrayB(word** a, int nFuncs)
{
    int i;
    word* b;
    b = (word*)malloc(sizeof(word)*(nFuncs));
    for(i=0;i<nFuncs;i++)
        b[i] = a[i][0];

    return b;
}